

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hh
# Opt level: O0

void __thiscall avro::Exception::Exception(Exception *this,format *msg)

{
  vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_30 [48];
  
  pvVar1 = &in_RDI->items_;
  boost::str<char,std::char_traits<char>,std::allocator<char>>(in_RDI);
  std::runtime_error::runtime_error
            ((runtime_error *)
             &(pvVar1->
              super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish,local_30);
  std::__cxx11::string::~string(local_30);
  (in_RDI->items_).
  super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2632c0;
  (in_RDI->items_).
  super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(vtable + 0x48);
  return;
}

Assistant:

Exception(const boost::format &msg) :
        std::runtime_error( boost::str(msg))
    { }